

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

ssize_t __thiscall Instance::read(Instance *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  runtime_error *prVar3;
  reference pvVar4;
  reference pvVar5;
  int *piVar6;
  reference __b;
  reference pvVar7;
  size_type sVar8;
  int iVar9;
  undefined4 in_register_00000034;
  undefined8 uVar10;
  double dVar11;
  value_type local_2931;
  int local_2670;
  int local_266c;
  int i_2;
  int i_1;
  char _error_msg__35 [256];
  char _error_msg__34 [256];
  char _error_msg__33 [256];
  int local_235c;
  char local_2358 [4];
  int tbinary;
  char _error_msg__32 [256];
  char _error_msg__31 [256];
  int local_214c;
  char local_2148 [4];
  int trelax;
  char _error_msg__30 [256];
  char _error_msg__29 [256];
  char _error_msg__28 [256];
  value_type_conflict1 local_1e39;
  char local_1e38 [8];
  char _error_msg__27 [256];
  value_type_conflict1 local_1d2a [2];
  char local_1d28 [8];
  char _error_msg__26 [256];
  char _error_msg__25 [256];
  int local_1b1c;
  char local_1b18 [4];
  int i;
  char _error_msg__24 [256];
  char _error_msg__23 [256];
  char _error_msg__22 [256];
  char buf [256];
  char _error_msg__21 [256];
  char _error_msg__20 [256];
  int d_4;
  int t_2;
  int iStack_1508;
  bool fits;
  int d_3;
  int t_1;
  int d_2;
  undefined1 local_14f8 [8];
  vector<int,_std::allocator<int>_> maxW;
  char local_14d8 [4];
  int S;
  char _error_msg__19 [256];
  char _error_msg__18 [256];
  char _error_msg__17 [256];
  char _error_msg__16 [256];
  char _error_msg__15 [256];
  value_type local_fcc;
  reference pvStack_fc8;
  int d_1;
  Item *item;
  int local_f74;
  int local_f70;
  int opt;
  int nfits;
  char _error_msg__14 [256];
  char _error_msg__13 [256];
  char _error_msg__12 [256];
  char _error_msg__11 [256];
  value_type local_b60;
  int bi;
  int ti;
  int it_type;
  char _error_msg__10 [256];
  int local_a4c;
  char local_a48 [4];
  int it_count;
  char _error_msg__9 [256];
  char _error_msg__8 [256];
  char _error_msg__7 [256];
  char _error_msg__6 [256];
  int local_640;
  int local_63c;
  int d;
  int t;
  char _error_msg__5 [256];
  char _error_msg__4 [256];
  char _error_msg__3 [256];
  char _error_msg__2 [256];
  char _error_msg__1 [256];
  char local_128 [8];
  char _error_msg_ [256];
  ftype type_local;
  FILE *fin_local;
  Instance *this_local;
  
  uVar10 = CONCAT44(in_register_00000034,__fd);
  iVar9 = (int)__buf;
  iVar2 = __isoc99_fscanf(uVar10," #INSTANCE_BEGIN#");
  if (iVar2 != 0) {
    snprintf(local_128,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" #INSTANCE_BEGIN#\") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x6b);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,local_128);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = __isoc99_fscanf(uVar10," $INSTANCE {");
  if (iVar2 != 0) {
    snprintf(_error_msg__2 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \" $INSTANCE {\") == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x6c);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,_error_msg__2 + 0xf8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = __isoc99_fscanf(uVar10,"%d",this);
  if (iVar2 != 1) {
    snprintf(_error_msg__3 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \"%d\", &ndims) == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x6d);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,_error_msg__3 + 0xf8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->ndims < 1) {
    snprintf(_error_msg__4 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ndims >= 1",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x6e);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,_error_msg__4 + 0xf8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (iVar9 == 1) {
    iVar2 = __isoc99_fscanf(uVar10,"%d",&this->nbtypes);
    if (iVar2 != 1) {
      snprintf(_error_msg__5 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "fscanf(fin, \"%d\", &nbtypes) == 1",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
               ,0x71);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,_error_msg__5 + 0xf8);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->nbtypes < 1) {
      snprintf((char *)&d,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
               "nbtypes >= 1",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
               ,0x72);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,(char *)&d);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    this->nbtypes = 1;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(&this->Ws,(long)this->nbtypes);
  std::vector<int,_std::allocator<int>_>::resize(&this->Cs,(long)this->nbtypes);
  std::vector<int,_std::allocator<int>_>::resize(&this->Qs,(long)this->nbtypes);
  for (local_63c = 0; local_63c < this->nbtypes; local_63c = local_63c + 1) {
    pvVar4 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[](&this->Ws,(long)local_63c);
    std::vector<int,_std::allocator<int>_>::resize(pvVar4,(long)this->ndims);
    for (local_640 = 0; local_640 < this->ndims; local_640 = local_640 + 1) {
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->Ws,(long)local_63c);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_640);
      iVar2 = __isoc99_fscanf(uVar10,"%d",pvVar5);
      if (iVar2 != 1) {
        snprintf(_error_msg__7 + 0xf8,0x100,
                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \"%d\", &Ws[t][d]) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x7d);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,_error_msg__7 + 0xf8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->Ws,(long)local_63c);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)local_640);
      if (*pvVar5 < 0) {
        snprintf(_error_msg__8 + 0xf8,0x100,
                 "AssertionError: assertion `%s` failed in \"%s\" line %d","Ws[t][d] >= 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x7e);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,_error_msg__8 + 0xf8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (iVar9 == 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Cs,(long)local_63c);
      iVar2 = __isoc99_fscanf(uVar10,"%d",pvVar5);
      if (iVar2 != 1) {
        snprintf(_error_msg__9 + 0xf8,0x100,
                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \"%d\", &Cs[t]) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x81);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,_error_msg__9 + 0xf8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Qs,(long)local_63c);
      iVar2 = __isoc99_fscanf(uVar10,"%d",pvVar5);
      if (iVar2 != 1) {
        snprintf(local_a48,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \"%d\", &Qs[t]) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x82);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,local_a48);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    else {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Cs,(long)local_63c);
      *pvVar5 = 1;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&this->Qs,(long)local_63c);
      *pvVar5 = -1;
    }
  }
  std::vector<Item,_std::allocator<Item>_>::clear(&this->items);
  std::vector<int,_std::allocator<int>_>::clear(&this->nopts);
  std::vector<char,_std::allocator<char>_>::clear(&this->ctypes);
  std::vector<int,_std::allocator<int>_>::clear(&this->demands);
  local_a4c = 0;
  iVar2 = __isoc99_fscanf(uVar10,"%d",&this->m);
  if (iVar2 != 1) {
    snprintf((char *)&ti,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fscanf(fin, \"%d\", &m) == 1",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x8e);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,(char *)&ti);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bi = 0;
  do {
    if (this->m <= bi) {
      iVar2 = __isoc99_fscanf(uVar10," } ;");
      if (0 < iVar2) {
        snprintf(buf + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \" } ;\") <= 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0xdd);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,buf + 0xf8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      do {
        while( true ) {
          iVar2 = __isoc99_fscanf(uVar10," $%[^{ \n]",_error_msg__22 + 0xf8);
          if (iVar2 != 1) {
            iVar2 = __isoc99_fscanf(uVar10," #INSTANCE_END#");
            if (iVar2 < 1) {
              for (local_266c = 0; local_266c < this->m; local_266c = local_266c + 1) {
                pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                                   (&this->ctypes,(long)local_266c);
                if (*pvVar7 == '*') {
                  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&this->demands,(long)local_266c);
                  local_2931 = '=';
                  if (1 < *pvVar5) {
                    local_2931 = '>';
                  }
                  pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                                     (&this->ctypes,(long)local_266c);
                  *pvVar7 = local_2931;
                }
              }
              this->n = 0;
              for (local_2670 = 0; local_2670 < this->m; local_2670 = local_2670 + 1) {
                pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&this->demands,(long)local_2670);
                this->n = *pvVar5 + this->n;
              }
              sVar8 = std::vector<Item,_std::allocator<Item>_>::size(&this->items);
              this->nsizes = (int)sVar8;
              return (ssize_t)this;
            }
            snprintf((char *)&i_2,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                     "fscanf(fin, \" #INSTANCE_END#\") <= 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                     ,0x107);
            prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar3,(char *)&i_2);
            __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar2 = strcmp(_error_msg__22 + 0xf8,"VTYPE");
          if (iVar2 == 0) break;
          iVar2 = strcmp(_error_msg__22 + 0xf8,"CTYPE");
          if (iVar2 == 0) {
            iVar2 = __isoc99_fscanf(uVar10," {");
            if (iVar2 != 0) {
              snprintf(local_1b18,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \" {\") == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0xe6);
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar3,local_1b18);
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::vector<char,_std::allocator<char>_>::clear(&this->ctypes);
            for (local_1b1c = 0; local_1b1c < this->m; local_1b1c = local_1b1c + 1) {
              if ((local_1b1c != 0) && (iVar2 = __isoc99_fscanf(uVar10," ,"), iVar2 != 0)) {
                snprintf(_error_msg__26 + 0xf8,0x100,
                         "AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "fscanf(fin, \" ,\") == 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                         ,0xe9);
                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar3,_error_msg__26 + 0xf8);
                __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              iVar2 = __isoc99_fscanf(uVar10," %[^}, \n]",_error_msg__22 + 0xf8);
              if (iVar2 != 1) {
                snprintf(local_1d28,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "fscanf(fin, \" %[^}, \\n]\", buf) == 1",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                         ,0xea);
                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar3,local_1d28);
                __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              iVar2 = strcmp(_error_msg__22 + 0xf8,">");
              if (iVar2 == 0) {
                local_1d2a[1] = 0x3e;
                std::vector<char,_std::allocator<char>_>::push_back(&this->ctypes,local_1d2a + 1);
              }
              else {
                iVar2 = strcmp(_error_msg__22 + 0xf8,"=");
                if (iVar2 == 0) {
                  local_1d2a[0] = '=';
                  std::vector<char,_std::allocator<char>_>::push_back(&this->ctypes,local_1d2a);
                }
                else {
                  iVar2 = strcmp(_error_msg__22 + 0xf8,"*");
                  if (iVar2 != 0) {
                    snprintf(local_1e38,0x100,
                             "AssertionError: assertion `%s` failed in \"%s\" line %d",
                             "!strcmp(buf, \"*\")",
                             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                             ,0xf0);
                    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::runtime_error::runtime_error(prVar3,local_1e38);
                    __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  local_1e39 = '*';
                  std::vector<char,_std::allocator<char>_>::push_back(&this->ctypes,&local_1e39);
                }
              }
            }
            iVar2 = __isoc99_fscanf(uVar10," } ;");
            if (iVar2 != 0) {
              snprintf(_error_msg__29 + 0xf8,0x100,
                       "AssertionError: assertion `%s` failed in \"%s\" line %d",
                       "fscanf(fin, \" } ;\") == 0",
                       "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                       ,0xf4);
              prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar3,_error_msg__29 + 0xf8);
              __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
          }
          else {
            iVar2 = strcmp(_error_msg__22 + 0xf8,"METHOD");
            if (iVar2 == 0) {
              iVar2 = __isoc99_fscanf(uVar10," { %d } ;",&this->method);
              if (iVar2 != 1) {
                snprintf(_error_msg__30 + 0xf8,0x100,
                         "AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "fscanf(fin, \" { %d } ;\", &method) == 1",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                         ,0xf6);
                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar3,_error_msg__30 + 0xf8);
                __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              if ((this->method < -3) || (-3 < this->method)) {
                snprintf(local_2148,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                         "method >= MIN_METHOD && method <= MAX_METHOD",
                         "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                         ,0xf7);
                prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(prVar3,local_2148);
                __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
            }
            else {
              iVar2 = strcmp(_error_msg__22 + 0xf8,"RELAX");
              if (iVar2 == 0) {
                local_214c = 0;
                iVar2 = __isoc99_fscanf(uVar10," { %d } ;",&local_214c);
                if (iVar2 != 1) {
                  snprintf(_error_msg__32 + 0xf8,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \" { %d } ;\", &trelax) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0xfa);
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar3,_error_msg__32 + 0xf8);
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                if ((local_214c != 0) && (local_214c != 1)) {
                  snprintf(local_2358,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "trelax == 0 || trelax == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0xfb);
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar3,local_2358);
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                this->relax_domains = local_214c != 0;
              }
              else {
                iVar2 = strcmp(_error_msg__22 + 0xf8,"BINARY");
                if (iVar2 != 0) {
                  printf("Invalid option \'%s\'!\n",_error_msg__22 + 0xf8);
                  exit(1);
                }
                local_235c = 0;
                iVar2 = __isoc99_fscanf(uVar10," { %d } ;",&local_235c);
                if (iVar2 != 1) {
                  snprintf(_error_msg__34 + 0xf8,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "fscanf(fin, \" { %d } ;\", &tbinary) == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0xff);
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar3,_error_msg__34 + 0xf8);
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                if ((local_235c != 0) && (local_235c != 1)) {
                  snprintf(_error_msg__35 + 0xf8,0x100,
                           "AssertionError: assertion `%s` failed in \"%s\" line %d",
                           "tbinary == 0 || tbinary == 1",
                           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                           ,0x100);
                  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error(prVar3,_error_msg__35 + 0xf8);
                  __cxa_throw(prVar3,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                this->binary = local_235c != 0;
              }
            }
          }
        }
        iVar2 = __isoc99_fscanf(uVar10," { %[^}, \n] } ;",_error_msg__22 + 0xf8);
        if (iVar2 != 1) {
          snprintf(_error_msg__23 + 0xf8,0x100,
                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                   "fscanf(fin, \" { %[^}, \\n] } ;\", buf) == 1",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                   ,0xe2);
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,_error_msg__23 + 0xf8);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this->vtype = _error_msg__22[0xf8];
      } while ((this->vtype == 'C') || (this->vtype == 'I'));
      snprintf(_error_msg__24 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d"
               ,"vtype == \'C\' || vtype == \'I\'",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
               ,0xe4);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,_error_msg__24 + 0xf8);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (iVar9 == 1) {
      iVar2 = __isoc99_fscanf(uVar10,"%d",&local_b60);
      if (iVar2 != 1) {
        snprintf(_error_msg__12 + 0xf8,0x100,
                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \"%d\", &ti) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x92);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,_error_msg__12 + 0xf8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (local_b60 < 0) {
        snprintf(_error_msg__13 + 0xf8,0x100,
                 "AssertionError: assertion `%s` failed in \"%s\" line %d","ti >= 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x93);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,_error_msg__13 + 0xf8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar2 = __isoc99_fscanf(uVar10,"%d",_error_msg__11 + 0xfc);
      if (iVar2 != 1) {
        snprintf(_error_msg__14 + 0xf8,0x100,
                 "AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "fscanf(fin, \"%d\", &bi) == 1",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x94);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,_error_msg__14 + 0xf8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((int)_error_msg__11._252_4_ < 0) {
        snprintf((char *)&nfits,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                 "bi >= 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0x95);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,(char *)&nfits);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->demands,(value_type *)(_error_msg__11 + 0xfc));
    }
    else {
      local_b60 = 1;
      _error_msg__11[0xfc] = -1;
      _error_msg__11[0xfd] = -1;
      _error_msg__11[0xfe] = -1;
      _error_msg__11[0xff] = -1;
    }
    std::vector<int,_std::allocator<int>_>::push_back(&this->nopts,&local_b60);
    opt._3_1_ = 0x2a;
    std::vector<char,_std::allocator<char>_>::push_back
              (&this->ctypes,(value_type_conflict1 *)((long)&opt + 3));
    local_f70 = 0;
    for (local_f74 = 0; local_f74 < local_b60; local_f74 = local_f74 + 1) {
      Item::Item((Item *)&item,this->ndims);
      std::vector<Item,_std::allocator<Item>_>::push_back(&this->items,(Item *)&item);
      Item::~Item((Item *)&item);
      pvStack_fc8 = std::vector<Item,_std::allocator<Item>_>::back(&this->items);
      if (local_b60 < 2) {
        pvStack_fc8->opt = -1;
      }
      else {
        pvStack_fc8->opt = local_f74;
      }
      for (local_fcc = 0; local_fcc < this->ndims; local_fcc = local_fcc + 1) {
        piVar6 = Item::operator[](pvStack_fc8,local_fcc);
        iVar2 = __isoc99_fscanf(uVar10,"%d",piVar6);
        if (iVar2 != 1) {
          snprintf(_error_msg__16 + 0xf8,0x100,
                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                   "fscanf(fin, \"%d\", &item[d]) == 1",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                   ,0xa9);
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,_error_msg__16 + 0xf8);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        piVar6 = Item::operator[](pvStack_fc8,local_fcc);
        if (*piVar6 < 0) {
          snprintf(_error_msg__17 + 0xf8,0x100,
                   "AssertionError: assertion `%s` failed in \"%s\" line %d","item[d] >= 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                   ,0xaa);
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,_error_msg__17 + 0xf8);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        piVar6 = Item::operator[](pvStack_fc8,local_fcc);
        if (*piVar6 != 0) {
          std::vector<int,_std::allocator<int>_>::push_back(&pvStack_fc8->nonzero,&local_fcc);
        }
      }
      bVar1 = std::vector<int,_std::allocator<int>_>::empty(&pvStack_fc8->nonzero);
      if (bVar1) {
        snprintf(_error_msg__18 + 0xf8,0x100,
                 "AssertionError: assertion `%s` failed in \"%s\" line %d","!item.nonzero.empty()",
                 "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                 ,0xaf);
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,_error_msg__18 + 0xf8);
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (iVar9 == 0) {
        iVar2 = __isoc99_fscanf(uVar10,"%d",_error_msg__11 + 0xfc);
        if (iVar2 != 1) {
          snprintf(_error_msg__19 + 0xf8,0x100,
                   "AssertionError: assertion `%s` failed in \"%s\" line %d",
                   "fscanf(fin, \"%d\", &bi) == 1",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                   ,0xb2);
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,_error_msg__19 + 0xf8);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        if ((int)_error_msg__11._252_4_ < 0) {
          snprintf(local_14d8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                   "bi >= 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
                   ,0xb3);
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,local_14d8);
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  (&this->demands,(value_type *)(_error_msg__11 + 0xfc));
      }
      pvStack_fc8->demand = _error_msg__11._252_4_;
      maxW.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      iVar2 = this->ndims;
      d_2 = 0;
      std::allocator<int>::allocator((allocator<int> *)((long)&t_1 + 3));
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_14f8,(long)iVar2,&d_2,
                 (allocator<int> *)((long)&t_1 + 3));
      std::allocator<int>::~allocator((allocator<int> *)((long)&t_1 + 3));
      for (d_3 = 0; d_3 < this->ndims; d_3 = d_3 + 1) {
        for (iStack_1508 = 0; iStack_1508 < this->nbtypes; iStack_1508 = iStack_1508 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_14f8,(long)d_3);
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&this->Ws,(long)iStack_1508);
          __b = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)d_3);
          piVar6 = std::max<int>(pvVar5,__b);
          iVar2 = *piVar6;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_14f8,(long)d_3);
          *pvVar5 = iVar2;
        }
      }
      for (t_2 = 0; t_2 < this->ndims; t_2 = t_2 + 1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_14f8,(long)t_2);
        if (0 < *pvVar5) {
          piVar6 = Item::operator[](pvStack_fc8,t_2);
          iVar2 = *piVar6;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_14f8,(long)t_2);
          dVar11 = round(((double)iVar2 / (double)*pvVar5) * 10000.0);
          maxW.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ =
               (int)((double)maxW.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_ + dVar11);
        }
      }
      if (0 < pvStack_fc8->demand) {
        bVar1 = false;
        _error_msg__20[0xfc] = '\0';
        _error_msg__20[0xfd] = '\0';
        _error_msg__20[0xfe] = '\0';
        _error_msg__20[0xff] = '\0';
        for (; (int)_error_msg__20._252_4_ < this->nbtypes;
            _error_msg__20._252_4_ = _error_msg__20._252_4_ + 1) {
          bVar1 = true;
          _error_msg__20[0xf8] = '\0';
          _error_msg__20[0xf9] = '\0';
          _error_msg__20[0xfa] = '\0';
          _error_msg__20[0xfb] = '\0';
          for (; (int)_error_msg__20._248_4_ < this->ndims;
              _error_msg__20._248_4_ = _error_msg__20._248_4_ + 1) {
            piVar6 = Item::operator[](pvStack_fc8,_error_msg__20._248_4_);
            iVar2 = *piVar6;
            pvVar4 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](&this->Ws,(long)(int)_error_msg__20._252_4_);
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               (pvVar4,(long)(int)_error_msg__20._248_4_);
            if (*pvVar5 < iVar2) {
              bVar1 = false;
              break;
            }
          }
          if (bVar1) break;
        }
        local_f70 = (uint)bVar1 + local_f70;
      }
      pvStack_fc8->key =
           maxW.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_;
      pvStack_fc8->type = bi;
      pvStack_fc8->id = local_a4c;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_14f8);
      local_a4c = local_a4c + 1;
    }
    if ((0 < (int)_error_msg__11._252_4_) && (local_f70 < 1)) {
      snprintf(_error_msg__21 + 0xf8,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d"
               ,"nfits >= 1",
               "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
               ,0xda);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,_error_msg__21 + 0xf8);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    bi = bi + 1;
  } while( true );
}

Assistant:

void Instance::read(FILE *fin, ftype type) {
	throw_assert(fscanf(fin, " #INSTANCE_BEGIN#") == 0);
	throw_assert(fscanf(fin, " $INSTANCE {") == 0);
	throw_assert(fscanf(fin, "%d", &ndims) == 1);
	throw_assert(ndims >= 1);

	if (type == MVP) {
		throw_assert(fscanf(fin, "%d", &nbtypes) == 1);
		throw_assert(nbtypes >= 1);
	} else {
		nbtypes = 1;
	}

	Ws.resize(nbtypes);
	Cs.resize(nbtypes);
	Qs.resize(nbtypes);
	for (int t = 0; t < nbtypes; t++) {
		Ws[t].resize(ndims);
		for (int d = 0; d < ndims; d++) {
			throw_assert(fscanf(fin, "%d", &Ws[t][d]) == 1);
			throw_assert(Ws[t][d] >= 0);
		}
		if (type == MVP) {
			throw_assert(fscanf(fin, "%d", &Cs[t]) == 1);
			throw_assert(fscanf(fin, "%d", &Qs[t]) == 1);
		} else {
			Cs[t] = 1;
			Qs[t] = -1;
		}
	}

	items.clear();
	nopts.clear();
	ctypes.clear();
	demands.clear();
	int it_count = 0;
	throw_assert(fscanf(fin, "%d", &m) == 1);
	for (int it_type = 0; it_type < m; it_type++) {
		int ti, bi;
		if (type == MVP) {
			throw_assert(fscanf(fin, "%d", &ti) == 1);
			throw_assert(ti >= 0);
			throw_assert(fscanf(fin, "%d", &bi) == 1);
			throw_assert(bi >= 0);
			demands.push_back(bi);
		} else {
			ti = 1;
			bi = -1;
		}
		nopts.push_back(ti);
		ctypes.push_back('*');

		int nfits = 0;
		for (int opt = 0; opt < ti; opt++) {
			items.push_back(Item(ndims));
			Item &item = items.back();
			if (ti > 1) {
				item.opt = opt;
			} else {
				item.opt = -1;
			}

			for (int d = 0; d < ndims; d++) {
				throw_assert(fscanf(fin, "%d", &item[d]) == 1);
				throw_assert(item[d] >= 0);
				if (item[d] != 0) {
					item.nonzero.push_back(d);
				}
			}
			throw_assert(!item.nonzero.empty());

			if (type == VBP) {
				throw_assert(fscanf(fin, "%d", &bi) == 1);
				throw_assert(bi >= 0);
				demands.push_back(bi);
			}
			item.demand = bi;

			int S = 0;
			std::vector<int> maxW(ndims, 0);
			for (int d = 0; d < ndims; d++) {
				for (int t = 0; t < nbtypes; t++) {
					maxW[d] = std::max(maxW[d], Ws[t][d]);
				}
			}
			for (int d = 0; d < ndims; d++) {
				if (maxW[d] > 0) {
					S += round(
							item[d] / static_cast<double>(maxW[d]) * NORM_PRECISION);
				}
			}
			if (item.demand > 0) {
				bool fits = false;
				for (int t = 0; t < nbtypes; t++) {
					fits = true;
					for (int d = 0; d < ndims; d++) {
						if (item[d] > Ws[t][d]) {
							fits = false;
							break;
						}
					}
					if (fits) {
						break;
					}
				}
				nfits += fits;
			}
			item.key = S;
			item.type = it_type;
			item.id = it_count++;
		}
		if (bi > 0) {
			throw_assert(nfits >= 1);
		}
	}
	throw_assert(fscanf(fin, " } ;") <= 0);

	char buf[MAX_LEN];
	while (fscanf(fin, " $%[^{ \n]", buf) == 1) {
		if (!strcmp(buf, "VTYPE")) {
			throw_assert(fscanf(fin, " { %[^}, \n] } ;", buf) == 1);
			vtype = buf[0];
			throw_assert(vtype == 'C' || vtype == 'I');
		} else if (!strcmp(buf, "CTYPE")) {
			throw_assert(fscanf(fin, " {") == 0);
			ctypes.clear();
			for (int i = 0; i < m; i++) {
				if (i) throw_assert(fscanf(fin, " ,") == 0);
				throw_assert(fscanf(fin, " %[^}, \n]", buf) == 1);
				if (!strcmp(buf, ">")) {
					ctypes.push_back('>');
				} else if (!strcmp(buf, "=")) {
					ctypes.push_back('=');
				} else {
					throw_assert(!strcmp(buf, "*"));
					ctypes.push_back('*');
				}
			}
			throw_assert(fscanf(fin, " } ;") == 0);
		} else if (!strcmp(buf, "METHOD")) {
			throw_assert(fscanf(fin, " { %d } ;", &method) == 1);
			throw_assert(method >= MIN_METHOD && method <= MAX_METHOD);
		} else if (!strcmp(buf, "RELAX")) {
			int trelax = 0;
			throw_assert(fscanf(fin, " { %d } ;", &trelax) == 1);
			throw_assert(trelax == 0 || trelax == 1);
			relax_domains = trelax;
		} else if (!strcmp(buf, "BINARY")) {
			int tbinary = 0;
			throw_assert(fscanf(fin, " { %d } ;", &tbinary) == 1);
			throw_assert(tbinary == 0 || tbinary == 1);
			binary = tbinary;
		} else {
			printf("Invalid option '%s'!\n", buf);
			exit(1);
		}
	}
	throw_assert(fscanf(fin, " #INSTANCE_END#") <= 0);

	for (int i = 0; i < m; i++) {
		if (ctypes[i] == '*') {
			ctypes[i] = (demands[i] <= 1) ? '=' : '>';
		}
	}

	n = 0;
	for (int i = 0; i < m; i++) {
		n += demands[i];
	}

	nsizes = items.size();
}